

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

uint32_t __thiscall icu_63::CopyHelper::copyCE32(CopyHelper *this,uint32_t ce32)

{
  short sVar1;
  long lVar2;
  CollationDataBuilder *pCVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  int32_t index;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  long lVar10;
  void *pvVar11;
  void *pvVar12;
  ushort *puVar13;
  int32_t j;
  ulong uVar14;
  int32_t start;
  ulong uVar15;
  ulong uVar16;
  int32_t *newCE32s;
  int64_t *ces;
  uint local_84;
  UnicodeString local_70;
  undefined4 extraout_var_01;
  
  if ((~ce32 & 0xc0) == 0) {
    uVar6 = ce32 & 0xf;
    if (uVar6 == 7) {
      pvVar11 = UVector::elementAt(&this->src->conditionalCE32s,ce32 >> 0xd);
      pCVar3 = this->dest;
      uVar8 = copyCE32(this,*(uint32_t *)((long)pvVar11 + 0x48));
      index = CollationDataBuilder::addConditionalCE32
                        (pCVar3,(UnicodeString *)((long)pvVar11 + 8),uVar8,&this->errorCode);
      ce32 = index << 0xd | 199;
      iVar7 = *(int *)((long)pvVar11 + 0x54);
      if (-1 < iVar7) {
        do {
          pvVar11 = UVector::elementAt(&this->src->conditionalCE32s,iVar7);
          pvVar12 = UVector::elementAt(&this->dest->conditionalCE32s,index);
          pCVar3 = this->dest;
          uVar8 = copyCE32(this,*(uint32_t *)((long)pvVar11 + 0x48));
          index = CollationDataBuilder::addConditionalCE32
                            (pCVar3,(UnicodeString *)((long)pvVar11 + 8),uVar8,&this->errorCode);
          sVar1 = *(short *)((long)pvVar11 + 0x10);
          if (sVar1 < 0) {
            iVar7 = *(int *)((long)pvVar11 + 0x14);
          }
          else {
            iVar7 = (int)sVar1 >> 5;
          }
          if (iVar7 == 0) {
            start = 0x10000;
          }
          else {
            if (((int)sVar1 & 2U) == 0) {
              puVar13 = *(ushort **)((long)pvVar11 + 0x20);
            }
            else {
              puVar13 = (ushort *)((long)pvVar11 + 0x12);
            }
            start = *puVar13 + 1;
          }
          pCVar3 = this->dest;
          icu_63::UnicodeString::tempSubString
                    (&local_70,(UnicodeString *)((long)pvVar11 + 8),start,0x7fffffff);
          UnicodeSet::addAll(&pCVar3->unsafeBackwardSet,&local_70);
          icu_63::UnicodeString::~UnicodeString(&local_70);
          *(int32_t *)((long)pvVar12 + 0x54) = index;
          iVar7 = *(int *)((long)pvVar11 + 0x54);
        } while (-1 < iVar7);
      }
    }
    else {
      if (uVar6 == 6) {
        ces = (int64_t *)((ulong)(ce32 >> 10 & 0x3ffff8) + (long)(this->src->ce64s).elements);
        local_84 = ce32 >> 8 & 0x1f;
        if (local_84 != 0) {
          uVar16 = 0;
          bVar4 = false;
          do {
            lVar2 = ces[uVar16];
            iVar7 = (*(this->modifier->super_UObject)._vptr_UObject[4])(this->modifier,lVar2);
            lVar10 = CONCAT44(extraout_var_01,iVar7);
            if (lVar10 == 0x101000100) {
              lVar10 = lVar2;
              if (bVar4) goto LAB_00224ed3;
              bVar5 = true;
              bVar4 = false;
            }
            else {
              if (uVar16 != 0 && !bVar4) {
                uVar9 = 0;
                do {
                  this->modifiedCEs[uVar9] = ces[uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar16 != uVar9);
              }
LAB_00224ed3:
              this->modifiedCEs[uVar16] = lVar10;
              bVar4 = true;
              bVar5 = false;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != local_84);
          if (!bVar5) {
LAB_00225056:
            uVar8 = (*(this->dest->super_UObject)._vptr_UObject[4])
                              (this->dest,this->modifiedCEs,(ulong)local_84,&this->errorCode);
            return uVar8;
          }
        }
        uVar8 = CollationDataBuilder::encodeExpansion(this->dest,ces,local_84,&this->errorCode);
        return uVar8;
      }
      if (uVar6 == 5) {
        newCE32s = (int32_t *)((ulong)(ce32 >> 0xb & 0x1ffffc) + (long)(this->src->ce32s).elements);
        local_84 = ce32 >> 8 & 0x1f;
        if (local_84 != 0) {
          uVar16 = 0;
          bVar4 = false;
          do {
            uVar6 = newCE32s[uVar16];
            if ((~uVar6 & 0xc0) == 0) {
LAB_00224d04:
              if (bVar4) {
                if ((uVar6 & 0xff) < 0xc0) {
                  uVar9 = (ulong)((uVar6 & 0xff) << 8) |
                          CONCAT44(uVar6,uVar6 << 0x10) & 0xffff0000ff000000;
                }
                else {
                  uVar9 = (ulong)(uVar6 & 0xffffff00);
                  if ((uVar6 & 0xf) == 1) {
                    uVar9 = uVar9 << 0x20 | 0x5000500;
                  }
                }
                goto LAB_00224dd0;
              }
              bVar5 = true;
              bVar4 = false;
            }
            else {
              iVar7 = (*(this->modifier->super_UObject)._vptr_UObject[3])
                                (this->modifier,(ulong)uVar6);
              uVar9 = CONCAT44(extraout_var,iVar7);
              if (uVar9 == 0x101000100) goto LAB_00224d04;
              if (uVar16 != 0 && !bVar4) {
                uVar14 = 0;
                do {
                  uVar6 = newCE32s[uVar14];
                  if ((uVar6 & 0xff) < 0xc0) {
                    uVar15 = (ulong)((uVar6 & 0xff) << 8) |
                             CONCAT44(uVar6,uVar6 << 0x10) & 0xffff0000ff000000;
                  }
                  else {
                    uVar15 = (ulong)(uVar6 & 0xffffff00);
                    if ((uVar6 & 0xf) == 1) {
                      uVar15 = uVar15 << 0x20 | 0x5000500;
                    }
                  }
                  this->modifiedCEs[uVar14] = uVar15;
                  uVar14 = uVar14 + 1;
                } while (uVar16 != uVar14);
              }
LAB_00224dd0:
              this->modifiedCEs[uVar16] = uVar9;
              bVar4 = true;
              bVar5 = false;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != local_84);
          if (!bVar5) goto LAB_00225056;
        }
        uVar8 = CollationDataBuilder::encodeExpansion32
                          (this->dest,newCE32s,local_84,&this->errorCode);
        return uVar8;
      }
    }
  }
  else {
    iVar7 = (*(this->modifier->super_UObject)._vptr_UObject[3])(this->modifier,ce32);
    if (CONCAT44(extraout_var_00,iVar7) != 0x101000100) {
      uVar8 = CollationDataBuilder::encodeOneCE
                        (this->dest,CONCAT44(extraout_var_00,iVar7),&this->errorCode);
      return uVar8;
    }
  }
  return ce32;
}

Assistant:

uint32_t copyCE32(uint32_t ce32) {
        if(!Collation::isSpecialCE32(ce32)) {
            int64_t ce = modifier.modifyCE32(ce32);
            if(ce != Collation::NO_CE) {
                ce32 = dest.encodeOneCE(ce, errorCode);
            }
        } else {
            int32_t tag = Collation::tagFromCE32(ce32);
            if(tag == Collation::EXPANSION32_TAG) {
                const uint32_t *srcCE32s = reinterpret_cast<uint32_t *>(src.ce32s.getBuffer());
                srcCE32s += Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                // Inspect the source CE32s. Just copy them if none are modified.
                // Otherwise copy to modifiedCEs, with modifications.
                UBool isModified = FALSE;
                for(int32_t i = 0; i < length; ++i) {
                    ce32 = srcCE32s[i];
                    int64_t ce;
                    if(Collation::isSpecialCE32(ce32) ||
                            (ce = modifier.modifyCE32(ce32)) == Collation::NO_CE) {
                        if(isModified) {
                            modifiedCEs[i] = Collation::ceFromCE32(ce32);
                        }
                    } else {
                        if(!isModified) {
                            for(int32_t j = 0; j < i; ++j) {
                                modifiedCEs[j] = Collation::ceFromCE32(srcCE32s[j]);
                            }
                            isModified = TRUE;
                        }
                        modifiedCEs[i] = ce;
                    }
                }
                if(isModified) {
                    ce32 = dest.encodeCEs(modifiedCEs, length, errorCode);
                } else {
                    ce32 = dest.encodeExpansion32(
                        reinterpret_cast<const int32_t *>(srcCE32s), length, errorCode);
                }
            } else if(tag == Collation::EXPANSION_TAG) {
                const int64_t *srcCEs = src.ce64s.getBuffer();
                srcCEs += Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                // Inspect the source CEs. Just copy them if none are modified.
                // Otherwise copy to modifiedCEs, with modifications.
                UBool isModified = FALSE;
                for(int32_t i = 0; i < length; ++i) {
                    int64_t srcCE = srcCEs[i];
                    int64_t ce = modifier.modifyCE(srcCE);
                    if(ce == Collation::NO_CE) {
                        if(isModified) {
                            modifiedCEs[i] = srcCE;
                        }
                    } else {
                        if(!isModified) {
                            for(int32_t j = 0; j < i; ++j) {
                                modifiedCEs[j] = srcCEs[j];
                            }
                            isModified = TRUE;
                        }
                        modifiedCEs[i] = ce;
                    }
                }
                if(isModified) {
                    ce32 = dest.encodeCEs(modifiedCEs, length, errorCode);
                } else {
                    ce32 = dest.encodeExpansion(srcCEs, length, errorCode);
                }
            } else if(tag == Collation::BUILDER_DATA_TAG) {
                // Copy the list of ConditionalCE32.
                ConditionalCE32 *cond = src.getConditionalCE32ForCE32(ce32);
                U_ASSERT(!cond->hasContext());
                int32_t destIndex = dest.addConditionalCE32(
                        cond->context, copyCE32(cond->ce32), errorCode);
                ce32 = CollationDataBuilder::makeBuilderContextCE32(destIndex);
                while(cond->next >= 0) {
                    cond = src.getConditionalCE32(cond->next);
                    ConditionalCE32 *prevDestCond = dest.getConditionalCE32(destIndex);
                    destIndex = dest.addConditionalCE32(
                            cond->context, copyCE32(cond->ce32), errorCode);
                    int32_t suffixStart = cond->prefixLength() + 1;
                    dest.unsafeBackwardSet.addAll(cond->context.tempSubString(suffixStart));
                    prevDestCond->next = destIndex;
                }
            } else {
                // Just copy long CEs and Latin mini expansions (and other expected values) as is,
                // assuming that the modifier would not modify them.
                U_ASSERT(tag == Collation::LONG_PRIMARY_TAG ||
                        tag == Collation::LONG_SECONDARY_TAG ||
                        tag == Collation::LATIN_EXPANSION_TAG ||
                        tag == Collation::HANGUL_TAG);
            }
        }
        return ce32;
    }